

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O1

Value __thiscall
MiniScript::Parser::ParseMap(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  long *plVar1;
  int iVar2;
  ParseState *this_00;
  Token *pTVar3;
  Type TVar4;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX_02;
  anon_union_8_3_2f476f46_for_data extraout_RDX_03;
  anon_union_8_3_2f476f46_for_data extraout_RDX_04;
  anon_union_8_3_2f476f46_for_data extraout_RDX_05;
  anon_union_8_3_2f476f46_for_data extraout_RDX_06;
  anon_union_8_3_2f476f46_for_data extraout_RDX_07;
  anon_union_8_3_2f476f46_for_data extraout_RDX_08;
  anon_union_8_3_2f476f46_for_data extraout_RDX_09;
  anon_union_8_3_2f476f46_for_data aVar5;
  Parser *pPVar6;
  Value VVar7;
  ValueDict map;
  Value *result;
  Value key;
  Value value;
  Value local_1f8;
  Value local_1e8;
  String local_1d8;
  String local_1c8;
  Token local_1b8;
  Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> local_198;
  Parser *local_180;
  Value local_178;
  Lexer local_168;
  undefined1 local_160 [8];
  anon_union_8_3_2f476f46_for_data local_158;
  Lexer local_150;
  bool local_148 [8];
  StringStorage *local_140;
  Lexer local_138;
  Lexer local_130;
  Lexer local_128;
  Lexer local_120;
  Lexer local_118;
  TACLine local_110;
  Token local_b0;
  Token local_90;
  Token local_70;
  Token local_50;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_180 = this;
  Lexer::Peek(&local_1b8,this_01);
  TVar4 = local_1b8.type;
  if ((local_1b8.text.ss != (StringStorage *)0x0) && (local_1b8.text.isTemp == false)) {
    plVar1 = &((local_1b8.text.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((local_1b8.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_1b8.text.ss = (StringStorage *)0x0;
  }
  pPVar6 = local_180;
  if (TVar4 == LCurly) {
    Lexer::Dequeue(&local_50,this_01);
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar1 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    local_198._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
    local_198.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
    local_198.isTemp = false;
    Lexer::Peek(&local_1b8,this_01);
    TVar4 = local_1b8.type;
    if ((local_1b8.text.ss != (StringStorage *)0x0) && (local_1b8.text.isTemp == false)) {
      plVar1 = &((local_1b8.text.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_1b8.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_1b8.text.ss = (StringStorage *)0x0;
    }
    if (TVar4 == RCurly) {
      Lexer::Dequeue(&local_70,this_01);
      if ((local_70.text.ss != (StringStorage *)0x0) && (local_70.text.isTemp == false)) {
        pTVar3 = &local_70;
LAB_0017b5e2:
        plVar1 = &((local_70.text.ss)->super_RefCountedStorage).refCount;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (*((local_70.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        (pTVar3->text).ss = (StringStorage *)0x0;
      }
    }
    else {
      do {
        local_118.ls = this_01->ls;
        if (local_118.ls != (LexerStorage *)0x0) {
          (local_118.ls)->refCount = (local_118.ls)->refCount + 1;
        }
        AllowLineBreak(&local_118);
        Lexer::release(&local_118);
        Lexer::Peek(&local_1b8,this_01);
        TVar4 = local_1b8.type;
        if ((local_1b8.text.ss != (StringStorage *)0x0) && (local_1b8.text.isTemp == false)) {
          plVar1 = &((local_1b8.text.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_1b8.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_1b8.text.ss = (StringStorage *)0x0;
        }
        if (TVar4 == RCurly) {
          Lexer::Dequeue(&local_90,this_01);
          if ((local_90.text.ss != (StringStorage *)0x0) && (local_90.text.isTemp == false)) {
            pTVar3 = &local_90;
            local_70.text.ss = local_90.text.ss;
            goto LAB_0017b5e2;
          }
          break;
        }
        local_120.ls = this_01->ls;
        if (local_120.ls != (LexerStorage *)0x0) {
          (local_120.ls)->refCount = (local_120.ls)->refCount + 1;
        }
        ParseExpr((Parser *)local_160,tokens,SUB81(&local_120,0),false);
        Lexer::release(&local_120);
        local_128.ls = this_01->ls;
        if (local_128.ls != (LexerStorage *)0x0) {
          (local_128.ls)->refCount = (local_128.ls)->refCount + 1;
        }
        local_1c8.ss = (StringStorage *)0x0;
        local_1c8.isTemp = false;
        RequireToken(&local_b0,(Parser *)tokens,&local_128,Colon,&local_1c8);
        if ((local_b0.text.ss != (StringStorage *)0x0) && (local_b0.text.isTemp == false)) {
          plVar1 = &((local_b0.text.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_b0.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_b0.text.ss = (StringStorage *)0x0;
        }
        if ((local_1c8.ss != (StringStorage *)0x0) && (local_1c8.isTemp == false)) {
          plVar1 = &((local_1c8.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_1c8.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_1c8.ss = (StringStorage *)0x0;
        }
        Lexer::release(&local_128);
        local_130.ls = this_01->ls;
        if ((ParseState *)local_130.ls != (ParseState *)0x0) {
          (((ParseState *)local_130.ls)->code).ls =
               (ListStorage<MiniScript::TACLine> *)
               ((long)&(((((ParseState *)local_130.ls)->code).ls)->super_RefCountedStorage).
                       _vptr_RefCountedStorage + 1);
        }
        AllowLineBreak(&local_130);
        Lexer::release(&local_130);
        local_138.ls = this_01->ls;
        if (local_138.ls != (LexerStorage *)0x0) {
          (local_138.ls)->refCount = (local_138.ls)->refCount + 1;
        }
        ParseExpr((Parser *)local_148,tokens,SUB81(&local_138,0),false);
        Lexer::release(&local_138);
        Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
                  (&local_198,(Value *)local_160,(Value *)local_148);
        local_168.ls = this_01->ls;
        if (local_168.ls != (LexerStorage *)0x0) {
          (local_168.ls)->refCount = (local_168.ls)->refCount + 1;
        }
        local_1d8.ss = (StringStorage *)0x0;
        local_1d8.isTemp = false;
        RequireEitherToken(&local_1b8,(Parser *)tokens,&local_168,Comma,RCurly,&local_1d8);
        TVar4 = local_1b8.type;
        if ((local_1b8.text.ss != (StringStorage *)0x0) && (local_1b8.text.isTemp == false)) {
          plVar1 = &((local_1b8.text.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_1b8.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_1b8.text.ss = (StringStorage *)0x0;
        }
        if ((local_1d8.ss != (StringStorage *)0x0) && (local_1d8.isTemp == false)) {
          plVar1 = &((local_1d8.ss)->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*((local_1d8.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_1d8.ss = (StringStorage *)0x0;
        }
        Lexer::release(&local_168);
        if ((2 < local_148[0]) && (local_140 != (StringStorage *)0x0)) {
          plVar1 = &(local_140->super_RefCountedStorage).refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_140->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_140 = (StringStorage *)0x0;
        }
        if ((Temp < local_160[0]) && (local_158.ref != (RefCountedStorage *)0x0)) {
          plVar1 = &(local_158.ref)->refCount;
          *plVar1 = *plVar1 + -1;
          if (*plVar1 == 0) {
            (*(local_158.ref)->_vptr_RefCountedStorage[1])();
          }
          local_158.number = 0.0;
        }
      } while (TVar4 != RCurly);
    }
    pPVar6 = local_180;
    this_00 = (ParseState *)tokens[6].ls;
    iVar2 = this_00->nextTempNum;
    this_00->nextTempNum = iVar2 + 1;
    *(undefined2 *)&(local_180->errorContext).ss = 2;
    *(undefined1 *)((long)&(local_180->errorContext).ss + 2) = 0;
    *(int *)&(local_180->errorContext).isTemp = iVar2;
    local_1e8.type = Temp;
    local_1e8.noInvoke = false;
    local_1e8.localOnly = Off;
    local_1e8.data = *(anon_union_8_3_2f476f46_for_data *)&(local_180->errorContext).isTemp;
    Value::Value(&local_178,&local_198);
    local_1f8.type = Value::null;
    local_1f8.noInvoke = DAT_001d3321._0_1_;
    local_1f8.localOnly = DAT_001d3321._1_1_;
    local_1f8.data.ref = DAT_001d3328;
    if ((Temp < Value::null) && (DAT_001d3328 != (RefCountedStorage *)0x0)) {
      DAT_001d3328->refCount = DAT_001d3328->refCount + 1;
    }
    TACLine::TACLine(&local_110,&local_1e8,CopyA,&local_178,&local_1f8);
    ParseState::Add(this_00,&local_110);
    aVar5 = extraout_RDX_00;
    if ((local_110.location.context.ss != (StringStorage *)0x0) &&
       (local_110.location.context.isTemp == false)) {
      plVar1 = &((local_110.location.context.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_110.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_01;
      }
      local_110.location.context.ss = (StringStorage *)0x0;
    }
    if ((local_110.comment.ss != (StringStorage *)0x0) && (local_110.comment.isTemp == false)) {
      plVar1 = &((local_110.comment.ss)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_110.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_02;
      }
      local_110.comment.ss = (StringStorage *)0x0;
    }
    if ((2 < local_110.rhsB.type) && (local_110.rhsB.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_110.rhsB.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_110.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_03;
      }
      local_110.rhsB.data.number = 0.0;
    }
    if ((2 < local_110.rhsA.type) &&
       ((StringStorage *)local_110.rhsA.data.ref != (StringStorage *)0x0)) {
      plVar1 = &(local_110.rhsA.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_110.rhsA.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_04;
      }
      local_110.rhsA.data.number = 0.0;
    }
    if ((2 < local_110.lhs.type) &&
       ((ListStorage<MiniScript::JumpPoint> *)local_110.lhs.data.ref !=
        (ListStorage<MiniScript::JumpPoint> *)0x0)) {
      plVar1 = &(local_110.lhs.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((RefCountedStorage *)&(local_110.lhs.data.ref)->_vptr_RefCountedStorage)->
          _vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_05;
      }
      local_110.lhs.data.number = 0.0;
    }
    if ((Temp < local_1f8.type) && (local_1f8.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_1f8.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_1f8.data.ref)->_vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_06;
      }
      local_1f8.data.number = 0.0;
    }
    if ((Temp < local_178.type) && (local_178.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_178.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_178.data.ref)->_vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_07;
      }
      local_178.data.number = 0.0;
    }
    if ((Temp < local_1e8.type) && (local_1e8.data.ref != (RefCountedStorage *)0x0)) {
      plVar1 = &(local_1e8.data.ref)->refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*(local_1e8.data.ref)->_vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_08;
      }
      local_1e8.data.number = 0.0;
    }
    local_198._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
    if ((local_198.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
       (local_198.isTemp == false)) {
      plVar1 = &((local_198.ds)->super_RefCountedStorage).refCount;
      *plVar1 = *plVar1 + -1;
      if (*plVar1 == 0) {
        (*((local_198.ds)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar5 = extraout_RDX_09;
      }
    }
  }
  else {
    local_150.ls = this_01->ls;
    if (local_150.ls != (LexerStorage *)0x0) {
      (local_150.ls)->refCount = (local_150.ls)->refCount + 1;
    }
    ParseList(local_180,tokens,SUB81(&local_150,0),statementStart);
    Lexer::release(&local_150);
    aVar5 = extraout_RDX;
  }
  VVar7.data.number = aVar5.number;
  VVar7._0_8_ = pPVar6;
  return VVar7;
}

Assistant:

Value Parser::ParseMap(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseList;
		if (tokens.Peek().type != Token::Type::LCurly) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();
		// NOTE: we must be sure this map gets created at runtime, not here at parse time.
		// Since it is a mutable object, we need to return a different one each time
		// this code executes (in a loop, function, etc.).  So, we use Op.CopyA below!
		ValueDict map;
		if (tokens.Peek().type == Token::Type::RCurly) {
			tokens.Dequeue();
		} else while (true) {
			AllowLineBreak(tokens); // allow a line break after a comma or open brace
			
			// Allow the map to close with a } on its own line.
			if (tokens.Peek().type == Token::Type::RCurly) {
				tokens.Dequeue();
				break;
			}

			Value key = ParseExpr(tokens);
			RequireToken(tokens, Token::Type::Colon);
			AllowLineBreak(tokens); // allow a line break after a colon
			Value value = ParseExpr(tokens);

			map.SetValue(key, value);

			if (RequireEitherToken(tokens, Token::Type::Comma, Token::Type::RCurly).type == Token::Type::RCurly) break;
		}
		Value result = Value::Temp(output->nextTempNum++);
		output->Add(TACLine(result, TACLine::Op::CopyA, map));
		return result;
	}